

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O1

void lsp::LanguageService::start(string *address,uint32_t port)

{
  MessageParser *__p;
  IOHandler *pIVar1;
  __shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  XmlParser *__tmp_1;
  MessageParser *__tmp;
  bool bVar6;
  undefined1 local_1d8 [43];
  undefined1 local_1ad;
  uint32_t local_1ac;
  request_callback local_1a8;
  request_callback local_188;
  request_callback local_168;
  request_callback local_148;
  request_callback local_128;
  request_callback local_108;
  request_callback local_e8;
  request_callback local_c8;
  request_callback local_a8;
  notification_callback local_88;
  notification_callback local_68;
  notification_callback local_48;
  
  local_1d8._0_8_ = (element_type *)0x0;
  local_1ac = port;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lsp::IOHandler,std::allocator<lsp::IOHandler>,std::__cxx11::string&,unsigned_int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8),(IOHandler **)local_1d8,
             (allocator<lsp::IOHandler> *)&local_1ad,address,&local_1ac);
  _Var2._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_;
  _Var2._M_ptr = (element_type *)local_1d8._0_8_;
  local_1d8._0_8_ = (IOHandler *)0x0;
  local_1d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var3._M_pi = ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  bVar6 = ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2> = _Var2;
  if (bVar6) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x108);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176758;
  __p = (MessageParser *)(p_Var5 + 1);
  __gnu_cxx::new_allocator<lsp::MessageParser>::construct<lsp::MessageParser>
            ((new_allocator<lsp::MessageParser> *)local_1d8,__p);
  _Var3 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  bVar6 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var5;
  if (bVar6) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176810;
  xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  *(element_type **)&p_Var5[1]._M_use_count =
       xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5[1]._vptr__Sp_counted_base =
       (_func_int **)
       xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var3 = xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  bVar6 = xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  if (bVar6) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pIVar1 = (IOHandler *)(local_1d8 + 0x10);
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"initialized","");
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object = notification_initialized;
  local_48._M_invoker =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_notification_callback(peVar4,(string *)local_1d8,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"exit","");
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_object = notification_exit;
  local_68._M_invoker =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_68.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_notification_callback(peVar4,(string *)local_1d8,&local_68);
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,"workspace/didChangeConfiguration","");
  local_88.super__Function_base._M_functor._8_8_ = 0;
  local_88.super__Function_base._M_functor._M_unused._M_object =
       notification_workspace_didChangeConfiguration;
  local_88._M_invoker =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_88.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_notification_callback(peVar4,(string *)local_1d8,&local_88);
  if (local_88.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_88.super__Function_base._M_manager)
              ((_Any_data *)&local_88,(_Any_data *)&local_88,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"initialize","");
  local_a8.super__Function_base._M_functor._8_8_ = 0;
  local_a8.super__Function_base._M_functor._M_unused._M_object = request_initialize;
  local_a8._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_a8.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_a8);
  if (local_a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.super__Function_base._M_manager)
              ((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"shutdown","");
  local_c8.super__Function_base._M_functor._8_8_ = 0;
  local_c8.super__Function_base._M_functor._M_unused._M_object = request_shutdown;
  local_c8._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_c8.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_c8);
  if (local_c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8.super__Function_base._M_manager)
              ((_Any_data *)&local_c8,(_Any_data *)&local_c8,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"textDocument/definition","");
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_functor._M_unused._M_object = request_textDocument_definition;
  local_e8._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_e8.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_e8);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"textDocument/references","");
  local_108.super__Function_base._M_functor._8_8_ = 0;
  local_108.super__Function_base._M_functor._M_unused._M_object = request_textDocument_references;
  local_108._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_108.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_108);
  if (local_108.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.super__Function_base._M_manager)
              ((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"textDocument/hover","");
  local_128.super__Function_base._M_functor._8_8_ = 0;
  local_128.super__Function_base._M_functor._M_unused._M_object = request_textDocument_hover;
  local_128._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_128.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_128);
  if (local_128.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_128.super__Function_base._M_manager)
              ((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"treeView/getChildren","");
  local_148.super__Function_base._M_functor._8_8_ = 0;
  local_148.super__Function_base._M_functor._M_unused._M_object = request_treeView_getChildren;
  local_148._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_148.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_148);
  if (local_148.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.super__Function_base._M_manager)
              ((_Any_data *)&local_148,(_Any_data *)&local_148,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"textDocument/goToOwner","");
  local_168.super__Function_base._M_functor._8_8_ = 0;
  local_168.super__Function_base._M_functor._M_unused._M_object = request_textDocument_owner;
  local_168._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_168.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_168);
  if (local_168.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_168.super__Function_base._M_manager)
              ((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,"treeView/getNearestShortname","");
  local_188.super__Function_base._M_functor._8_8_ = 0;
  local_188.super__Function_base._M_functor._M_unused._M_object =
       request_treeView_getNearestShortname;
  local_188._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_188.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_188);
  if (local_188.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_188.super__Function_base._M_manager)
              ((_Any_data *)&local_188,(_Any_data *)&local_188,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  peVar4 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,"treeView/getParentElement","");
  local_1a8.super__Function_base._M_functor._8_8_ = 0;
  local_1a8.super__Function_base._M_functor._M_unused._M_object = request_treeView_getParentElement;
  local_1a8._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_1a8.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar4,(string *)local_1d8,&local_1a8);
  if (local_1a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1a8.super__Function_base._M_manager)
              ((_Any_data *)&local_1a8,(_Any_data *)&local_1a8,__destroy_functor);
  }
  if ((IOHandler *)local_1d8._0_8_ != pIVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  run();
  return;
}

Assistant:

void lsp::LanguageService::start(std::string address, uint32_t port)
{
    ioHandler_ = std::make_shared<lsp::IOHandler>(address, port);
    messageParser_ = std::make_shared<lsp::MessageParser>();
    xmlParser_ = std::make_shared<XmlParser>();

    //register Callbacks here
    messageParser_->register_notification_callback("initialized", lsp::LanguageService::notification_initialized);
    messageParser_->register_notification_callback("exit", lsp::LanguageService::notification_exit);
    messageParser_->register_notification_callback("workspace/didChangeConfiguration", lsp::LanguageService::notification_workspace_didChangeConfiguration);
    messageParser_->register_request_callback("initialize", lsp::LanguageService::request_initialize);
    messageParser_->register_request_callback("shutdown", lsp::LanguageService::request_shutdown);
    messageParser_->register_request_callback("textDocument/definition", lsp::LanguageService::request_textDocument_definition);
    messageParser_->register_request_callback("textDocument/references", lsp::LanguageService::request_textDocument_references);
    messageParser_->register_request_callback("textDocument/hover", lsp::LanguageService::request_textDocument_hover);
    messageParser_->register_request_callback("treeView/getChildren", lsp::LanguageService::request_treeView_getChildren);
    messageParser_->register_request_callback("textDocument/goToOwner", lsp::LanguageService::request_textDocument_owner);
    messageParser_->register_request_callback("treeView/getNearestShortname", lsp::LanguageService::request_treeView_getNearestShortname);
    messageParser_->register_request_callback("treeView/getParentElement", lsp::LanguageService::request_treeView_getParentElement);

    //begin the main run loop
    run();
}